

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

void Js::JavascriptExceptionOperators::ThrowStackOverflow
               (ScriptContext *scriptContext,PVOID returnAddress)

{
  DisableImplicitFlags *pDVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptExceptionObject *this_00;
  JavascriptError *object;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x50a,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_00aa369c;
    *puVar4 = 0;
  }
  scriptContext->soExceptionCount = scriptContext->soExceptionCount + 1;
  this = scriptContext->threadContext;
  this_00 = ThreadContext::GetPendingSOErrorObject(this);
  if (this_00 == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x50f,"(so)","so");
    if (!bVar3) {
LAB_00aa369c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pDVar1 = &this->disableImplicitFlags;
  *pDVar1 = *pDVar1 | DisableImplicitCallFlag;
  object = JavascriptLibrary::CreateStackOverflowError
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  JavascriptExceptionObject::SetThrownObject(this_00,object);
  ThrowExceptionObject(this_00,scriptContext,false,returnAddress,false);
}

Assistant:

void JavascriptExceptionOperators::ThrowStackOverflow(ScriptContext *scriptContext, PVOID returnAddress)
    {
        Assert(scriptContext);
        DebugOnly(++scriptContext->soExceptionCount);

        ThreadContext *threadContext = scriptContext->GetThreadContext();
        JavascriptExceptionObject *so = threadContext->GetPendingSOErrorObject();
        Assert(so);

        // Disable implicit call before calling into recycler (to prevent QueryContinue/dispose from leave script and stack overflow again)
        threadContext->DisableImplicitCall();

        Var thrownObject = scriptContext->GetLibrary()->CreateStackOverflowError();
        so->SetThrownObject(thrownObject);

        // NOTE: Do not ClearDisableImplicitFlags() here. We still need to allocate StackTrace, etc. Keep implicit call disabled till actual
        // throw (ThrowExceptionObjectInternal will ClearDisableImplicitFlags before throw). If anything wrong happens in between which throws
        // a new exception, the new throw will ClearDisableImplicitFlags.

        JavascriptExceptionOperators::ThrowExceptionObject(so, scriptContext, false, returnAddress);
    }